

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferViewVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferViewVkImpl::BufferViewVkImpl
          (BufferViewVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          BufferViewDesc *ViewDesc,IBuffer *pBuffer,BufferViewWrapper *BuffView,bool bIsDefaultView)

{
  BufferViewBase<Diligent::EngineVkImplTraits>::BufferViewBase
            (&this->super_BufferViewBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,ViewDesc
             ,pBuffer,bIsDefaultView,false);
  (this->super_BufferViewBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
  .super_ObjectBase<Diligent::IBufferViewVk>.super_RefCountedObject<Diligent::IBufferViewVk>.
  super_IBufferViewVk.super_IBufferView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_008918d0;
  VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
  VulkanObjectWrapper(&this->m_BuffView,BuffView);
  return;
}

Assistant:

BufferViewVkImpl::BufferViewVkImpl(IReferenceCounters*                  pRefCounters,
                                   RenderDeviceVkImpl*                  pDevice,
                                   const BufferViewDesc&                ViewDesc,
                                   IBuffer*                             pBuffer,
                                   VulkanUtilities::BufferViewWrapper&& BuffView,
                                   bool                                 bIsDefaultView) :
    // clang-format off
    TBufferViewBase
    {
        pRefCounters,
        pDevice,
        ViewDesc,
        pBuffer,
        bIsDefaultView
    },
    m_BuffView{std::move(BuffView)}
// clang-format on
{
}